

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::SparseBufferTestUtilities::getSparseBOFlagsString_abi_cxx11_
          (string *__return_storage_ptr__,SparseBufferTestUtilities *this,GLenum flags)

{
  ostream *poVar1;
  uint uVar2;
  bool *pbVar3;
  char cVar4;
  stringstream result_sstream;
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result_sstream);
  uVar2 = (uint)this;
  cVar4 = (uVar2 >> 9 & 1) != 0;
  if ((bool)cVar4) {
    std::operator<<(&local_190,"GL_CLIENT_STORAGE_BIT");
  }
  if ((uVar2 >> 8 & 1) != 0) {
    pbVar3 = (bool *)0x19188c1;
    if ((uVar2 >> 9 & 1) == 0) {
      pbVar3 = glcts::fixed_sample_locations_values + 1;
    }
    poVar1 = std::operator<<(&local_190,pbVar3);
    std::operator<<(poVar1,"GL_DYNAMIC_STORAGE_BIT");
    cVar4 = cVar4 + '\x01';
  }
  if ((char)this < '\0') {
    pbVar3 = (bool *)0x19188c1;
    if (cVar4 == '\0') {
      pbVar3 = glcts::fixed_sample_locations_values + 1;
    }
    poVar1 = std::operator<<(&local_190,pbVar3);
    std::operator<<(poVar1,"GL_MAP_COHERENT_BIT");
    cVar4 = cVar4 + '\x01';
  }
  if (((ulong)this & 0x40) != 0) {
    pbVar3 = (bool *)0x19188c1;
    if (cVar4 == '\0') {
      pbVar3 = glcts::fixed_sample_locations_values + 1;
    }
    poVar1 = std::operator<<(&local_190,pbVar3);
    std::operator<<(poVar1,"GL_MAP_PERSISTENT_BIT");
    cVar4 = '\x01';
  }
  if ((uVar2 >> 10 & 1) != 0) {
    pbVar3 = (bool *)0x19188c1;
    if (cVar4 == '\0') {
      pbVar3 = glcts::fixed_sample_locations_values + 1;
    }
    poVar1 = std::operator<<(&local_190,pbVar3);
    std::operator<<(poVar1,"GL_SPARSE_STORAGE_BIT");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&result_sstream);
  return __return_storage_ptr__;
}

Assistant:

std::string SparseBufferTestUtilities::getSparseBOFlagsString(glw::GLenum flags)
{
	unsigned int	  n_flags_added = 0;
	std::stringstream result_sstream;

	if ((flags & GL_CLIENT_STORAGE_BIT) != 0)
	{
		result_sstream << "GL_CLIENT_STORAGE_BIT";

		++n_flags_added;
	}

	if ((flags & GL_DYNAMIC_STORAGE_BIT) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_DYNAMIC_STORAGE_BIT";

		++n_flags_added;
	}

	if ((flags & GL_MAP_COHERENT_BIT) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_MAP_COHERENT_BIT";

		++n_flags_added;
	}

	if ((flags & GL_MAP_PERSISTENT_BIT) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_MAP_PERSISTENT_BIT";

		++n_flags_added;
	}

	if ((flags & GL_SPARSE_STORAGE_BIT_ARB) != 0)
	{
		result_sstream << ((n_flags_added) ? " | " : "") << "GL_SPARSE_STORAGE_BIT";

		++n_flags_added;
	}

	return result_sstream.str();
}